

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O0

void duckdb::
     HistogramBinUpdateFunction<duckdb::HistogramStringFunctor,duckdb::string_t,duckdb::HistogramRange>
               (Vector *inputs,AggregateInputData *aggr_input,idx_t input_count,Vector *state_vector
               ,idx_t count)

{
  string_t value;
  undefined1 uVar1;
  undefined1 uVar2;
  TemplatedValidityMask<unsigned_long> *pTVar3;
  string_t *psVar4;
  idx_t iVar5;
  ulong in_RCX;
  long in_RDI;
  UnifiedVectorFormat *in_R8;
  idx_t bin_entry;
  HistogramBinState<duckdb::string_t> *state;
  idx_t idx;
  idx_t i;
  string_t *data;
  HistogramBinState<duckdb::string_t> **states;
  UnifiedVectorFormat input_data;
  AggregateInputData *in_stack_000000b0;
  idx_t in_stack_000000b8;
  idx_t in_stack_000000c0;
  Vector *in_stack_000000c8;
  HistogramBinState<duckdb::string_t> *in_stack_000000d0;
  bool extra_state;
  Vector *bin_vector;
  UnifiedVectorFormat sdata;
  Vector *input;
  UnifiedVectorFormat *in_stack_fffffffffffffe98;
  UnifiedVectorFormat *in_stack_fffffffffffffea0;
  TemplatedValidityMask<unsigned_long> *in_stack_fffffffffffffea8;
  undefined6 in_stack_fffffffffffffeb0;
  undefined1 in_stack_fffffffffffffeb6;
  undefined1 in_stack_fffffffffffffeb7;
  TemplatedValidityMask<unsigned_long> *pTVar6;
  UnifiedVectorFormat *local_f8;
  SelectionVector *local_e0 [9];
  undefined1 local_91;
  long local_90;
  SelectionVector *local_78 [10];
  UnifiedVectorFormat *local_28;
  ulong local_20;
  long local_8;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_8 = in_RDI;
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_78);
  duckdb::Vector::ToUnifiedFormat(local_20,local_28);
  local_90 = local_8 + 0x68;
  local_91 = HistogramStringFunctor::CreateExtraState((idx_t)local_28);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_e0);
  HistogramStringFunctor::PrepareData
            ((Vector *)
             CONCAT17(in_stack_fffffffffffffeb7,
                      CONCAT16(in_stack_fffffffffffffeb6,in_stack_fffffffffffffeb0)),
             (idx_t)in_stack_fffffffffffffea8,(bool *)in_stack_fffffffffffffea0,
             in_stack_fffffffffffffe98);
  pTVar3 = (TemplatedValidityMask<unsigned_long> *)
           UnifiedVectorFormat::GetData<duckdb::HistogramBinState<duckdb::string_t>*>
                     ((UnifiedVectorFormat *)local_78);
  pTVar6 = pTVar3;
  psVar4 = UnifiedVectorFormat::GetData<duckdb::string_t>((UnifiedVectorFormat *)local_e0);
  for (local_f8 = (UnifiedVectorFormat *)0x0; local_f8 < local_28; local_f8 = local_f8 + 1) {
    SelectionVector::get_index(local_e0[0],(idx_t)local_f8);
    uVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (in_stack_fffffffffffffea8,(idx_t)in_stack_fffffffffffffea0);
    if ((bool)uVar1) {
      in_stack_fffffffffffffea8 = pTVar3;
      iVar5 = SelectionVector::get_index(local_78[0],(idx_t)local_f8);
      uVar2 = HistogramBinState<duckdb::string_t>::IsSet
                        ((HistogramBinState<duckdb::string_t> *)
                         (&in_stack_fffffffffffffea8->validity_mask)[iVar5]);
      if (!(bool)uVar2) {
        HistogramBinState<duckdb::string_t>::InitializeBins<duckdb::HistogramStringFunctor>
                  (in_stack_000000d0,in_stack_000000c8,in_stack_000000c0,in_stack_000000b8,
                   in_stack_000000b0);
      }
      value.value.pointer.ptr = (char *)pTVar6;
      value.value._0_8_ = psVar4;
      in_stack_fffffffffffffea0 =
           (UnifiedVectorFormat *)
           HistogramRange::GetBin<duckdb::string_t>
                     (value,(unsafe_vector<duckdb::string_t> *)
                            CONCAT17(uVar1,CONCAT16(uVar2,in_stack_fffffffffffffeb0)));
      in_stack_fffffffffffffe98 =
           (UnifiedVectorFormat *)
           vector<unsigned_long,_false>::operator[]
                     ((vector<unsigned_long,_false> *)in_stack_fffffffffffffea0,
                      (size_type)in_stack_fffffffffffffe98);
      *(value_type *)in_stack_fffffffffffffe98 = *(value_type *)in_stack_fffffffffffffe98 + 1;
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_fffffffffffffea0);
  UnifiedVectorFormat::~UnifiedVectorFormat(in_stack_fffffffffffffea0);
  return;
}

Assistant:

static void HistogramBinUpdateFunction(Vector inputs[], AggregateInputData &aggr_input, idx_t input_count,
                                       Vector &state_vector, idx_t count) {
	auto &input = inputs[0];
	UnifiedVectorFormat sdata;
	state_vector.ToUnifiedFormat(count, sdata);

	auto &bin_vector = inputs[1];

	auto extra_state = OP::CreateExtraState(count);
	UnifiedVectorFormat input_data;
	OP::PrepareData(input, count, extra_state, input_data);

	auto states = UnifiedVectorFormat::GetData<HistogramBinState<T> *>(sdata);
	auto data = UnifiedVectorFormat::GetData<T>(input_data);
	for (idx_t i = 0; i < count; i++) {
		auto idx = input_data.sel->get_index(i);
		if (!input_data.validity.RowIsValid(idx)) {
			continue;
		}
		auto &state = *states[sdata.sel->get_index(i)];
		if (!state.IsSet()) {
			state.template InitializeBins<OP>(bin_vector, count, i, aggr_input);
		}
		auto bin_entry = HIST::template GetBin<T>(data[idx], *state.bin_boundaries);
		++(*state.counts)[bin_entry];
	}
}